

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

int tx_elements_output_proof_init
              (wally_tx_output *output,uchar *surjectionproof,size_t surjectionproof_len,
              uchar *rangeproof,size_t rangeproof_len)

{
  _Bool _Var1;
  int iVar2;
  uchar *p;
  uchar *new_surjectionproof;
  uchar *new_rangeproof;
  
  new_surjectionproof = (uchar *)0x0;
  new_rangeproof = (uchar *)0x0;
  iVar2 = -2;
  if (((surjectionproof != (uchar *)0x0) != (surjectionproof_len == 0)) &&
     ((rangeproof != (uchar *)0x0) != (rangeproof_len == 0))) {
    _Var1 = clone_bytes(&new_surjectionproof,surjectionproof,surjectionproof_len);
    if (_Var1) {
      _Var1 = clone_bytes(&new_rangeproof,rangeproof,rangeproof_len);
      p = new_rangeproof;
      if (_Var1) {
        output->surjectionproof = new_surjectionproof;
        output->surjectionproof_len = surjectionproof_len;
        output->rangeproof = new_rangeproof;
        output->rangeproof_len = rangeproof_len;
        return 0;
      }
    }
    else {
      p = (uchar *)0x0;
    }
    clear_and_free(new_surjectionproof,surjectionproof_len);
    clear_and_free(p,rangeproof_len);
    iVar2 = -3;
  }
  return iVar2;
}

Assistant:

static int tx_elements_output_proof_init(
    struct wally_tx_output *output,
    const unsigned char *surjectionproof,
    size_t surjectionproof_len,
    const unsigned char *rangeproof,
    size_t rangeproof_len)
{
#ifdef BUILD_ELEMENTS
    unsigned char *new_surjectionproof = NULL, *new_rangeproof = NULL;
#endif
    (void) output;

    if (BYTES_INVALID(surjectionproof, surjectionproof_len) ||
        BYTES_INVALID(rangeproof, rangeproof_len))
        return WALLY_EINVAL;

#ifdef BUILD_ELEMENTS
    if (!clone_bytes(&new_surjectionproof, surjectionproof, surjectionproof_len) ||
        !clone_bytes(&new_rangeproof, rangeproof, rangeproof_len)) {
        clear_and_free(new_surjectionproof,  surjectionproof_len);
        clear_and_free(new_rangeproof, rangeproof_len);
        return WALLY_ENOMEM;
    }

    output->surjectionproof = new_surjectionproof;
    output->surjectionproof_len = surjectionproof_len;
    output->rangeproof = new_rangeproof;
    output->rangeproof_len = rangeproof_len;
#endif
    return WALLY_OK;
}